

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implementation.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
::delete_buckets(table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
                 *this)

{
  link_pointer ppVar1;
  link_pointer ppVar2;
  
  if (this->buckets_ != (bucket_pointer)0x0) {
    ppVar2 = this->buckets_[this->bucket_count_].next_;
    while (ppVar2 != (link_pointer)0x0) {
      ppVar1 = ppVar2->next_;
      operator_delete(ppVar2,0x20);
      ppVar2 = ppVar1;
    }
    destroy_buckets(this);
    this->size_ = 0;
    this->max_load_ = 0;
    this->buckets_ = (bucket_pointer)0x0;
  }
  return;
}

Assistant:

void delete_buckets()
        {
          if (buckets_) {
            node_pointer n =
              static_cast<node_pointer>(get_bucket(bucket_count_)->next_);

            if (bucket::extra_node) {
              node_pointer next = next_node(n);
              boost::unordered::detail::func::destroy(pointer<node>::get(n));
              node_allocator_traits::deallocate(node_alloc(), n, 1);
              n = next;
            }

            while (n) {
              node_pointer next = next_node(n);
              destroy_node(n);
              n = next;
            }

            destroy_buckets();
            buckets_ = bucket_pointer();
            max_load_ = 0;
            size_ = 0;
          }
        }